

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void XML_SetReturnNSTriplet(XML_Parser parser,int do_nst)

{
  if ((parser != (XML_Parser)0x0) &&
     (((parser->m_parsingStatus).parsing | XML_FINISHED) != XML_SUSPENDED)) {
    parser->m_ns_triplets = do_nst != 0;
    return;
  }
  return;
}

Assistant:

void XMLCALL
XML_SetReturnNSTriplet(XML_Parser parser, int do_nst)
{
  if (parser == NULL)
    return;
  /* block after XML_Parse()/XML_ParseBuffer() has been called */
  if (ps_parsing == XML_PARSING || ps_parsing == XML_SUSPENDED)
    return;
  ns_triplets = do_nst ? XML_TRUE : XML_FALSE;
}